

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.cc
# Opt level: O2

int __thiscall re2::RE2::Set::Add(Set *this,StringPiece *pattern,string *error)

{
  ushort uVar1;
  ParseFlags global_flags;
  Regexp *this_00;
  Regexp *pRVar2;
  Regexp **sub_00;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar3;
  ostream *poVar4;
  int i;
  int iVar5;
  ulong uVar6;
  Regexp *local_210;
  ulong local_208;
  Regexp *local_200;
  RegexpStatus status;
  string local_1d8;
  Regexp *sub [2];
  
  if (this->compiled_ == true) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)sub,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/set.cc",0x1e);
    std::operator<<((ostream *)(sub + 1),"RE2::Set::Add after Compile");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)sub);
    iVar5 = -1;
  }
  else {
    global_flags = Options::ParseFlags(&this->options_);
    status.code_ = kRegexpSuccess;
    status.error_arg_.ptr_ = (char *)0x0;
    status.error_arg_.length_ = 0;
    status.tmp_ = (string *)0x0;
    this_00 = Regexp::Parse(pattern,global_flags,&status);
    if (this_00 == (Regexp *)0x0) {
      if (error != (string *)0x0) {
        RegexpStatus::Text_abi_cxx11_((string *)sub,&status);
        std::__cxx11::string::operator=((string *)error,(string *)sub);
        std::__cxx11::string::~string((string *)sub);
      }
      iVar5 = -1;
      if ((this->options_).log_errors_ == true) {
        LogMessage::LogMessage
                  ((LogMessage *)sub,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/set.cc",
                   0x2b,2);
        poVar4 = std::operator<<((ostream *)(sub + 1),"Error parsing \'");
        poVar4 = operator<<(poVar4,pattern);
        poVar4 = std::operator<<(poVar4,"\': ");
        RegexpStatus::Text_abi_cxx11_(&local_1d8,&status);
        std::operator<<(poVar4,(string *)&local_1d8);
        std::__cxx11::string::~string((string *)&local_1d8);
        LogMessage::~LogMessage((LogMessage *)sub);
      }
    }
    else {
      uVar6 = (ulong)((long)(this->re_).
                            super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->re_).
                           super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>._M_impl
                           .super__Vector_impl_data._M_start) >> 3;
      pRVar2 = Regexp::HaveMatch((int)uVar6,global_flags);
      if (this_00->op_ == '\x05') {
        uVar1 = this_00->nsub_;
        local_208 = uVar6;
        local_200 = pRVar2;
        sub_00 = (Regexp **)operator_new__((ulong)((uint)uVar1 * 8 + 8));
        for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
          paVar3 = &this_00->field_5;
          if (1 < this_00->nsub_) {
            paVar3 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this_00->field_5).submany_;
          }
          pRVar2 = Regexp::Incref(paVar3[uVar6].subone_);
          sub_00[uVar6] = pRVar2;
        }
        sub_00[uVar1] = local_200;
        Regexp::Decref(this_00);
        local_210 = Regexp::Concat(sub_00,uVar1 + 1,global_flags);
        operator_delete__(sub_00);
        uVar6 = local_208;
      }
      else {
        sub[0] = this_00;
        sub[1] = pRVar2;
        local_210 = Regexp::Concat(sub,2,global_flags);
      }
      iVar5 = (int)uVar6;
      std::vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>::push_back(&this->re_,&local_210);
    }
    RegexpStatus::~RegexpStatus(&status);
  }
  return iVar5;
}

Assistant:

int RE2::Set::Add(const StringPiece& pattern, string* error) {
  if (compiled_) {
    LOG(DFATAL) << "RE2::Set::Add after Compile";
    return -1;
  }

  Regexp::ParseFlags pf = static_cast<Regexp::ParseFlags>(
    options_.ParseFlags());

  RegexpStatus status;
  re2::Regexp* re = Regexp::Parse(pattern, pf, &status);
  if (re == NULL) {
    if (error != NULL)
      *error = status.Text();
    if (options_.log_errors())
      LOG(ERROR) << "Error parsing '" << pattern << "': " << status.Text();
    return -1;
  }

  // Concatenate with match index and push on vector.
  int n = static_cast<int>(re_.size());
  re2::Regexp* m = re2::Regexp::HaveMatch(n, pf);
  if (re->op() == kRegexpConcat) {
    int nsub = re->nsub();
    re2::Regexp** sub = new re2::Regexp*[nsub + 1];
    for (int i = 0; i < nsub; i++)
      sub[i] = re->sub()[i]->Incref();
    sub[nsub] = m;
    re->Decref();
    re = re2::Regexp::Concat(sub, nsub + 1, pf);
    delete[] sub;
  } else {
    re2::Regexp* sub[2];
    sub[0] = re;
    sub[1] = m;
    re = re2::Regexp::Concat(sub, 2, pf);
  }
  re_.push_back(re);
  return n;
}